

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeIntConstant(Builder *this,Id typeId,uint value,bool specConstant)

{
  Id IVar1;
  Instruction *this_00;
  undefined4 in_register_00000034;
  size_t size;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_50 [3];
  pointer local_38;
  Instruction *c;
  Op local_28;
  Id existing;
  Op opcode;
  Id IStack_1c;
  bool specConstant_local;
  uint value_local;
  Id typeId_local;
  Builder *this_local;
  
  size = CONCAT44(in_register_00000034,typeId);
  local_28 = OpConstant;
  existing._3_1_ = specConstant;
  opcode = value;
  IStack_1c = typeId;
  _value_local = this;
  if (specConstant) {
    local_28 = OpSpecConstant;
  }
  else {
    size = 0x15;
    IVar1 = findScalarConstant(this,OpTypeInt,OpConstant,typeId,value);
    if (IVar1 != 0) {
      return IVar1;
    }
    c._4_4_ = 0;
  }
  this_00 = (Instruction *)Instruction::operator_new((Instruction *)0x38,size);
  IVar1 = getUniqueId(this);
  Instruction::Instruction(this_00,IVar1,IStack_1c,local_28);
  local_38 = this_00;
  Instruction::addImmediateOperand(this_00,opcode);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_50,local_38
            );
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,(value_type *)local_50);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_50);
  std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::push_back
            (this->groupedConstants + 0x15,&local_38);
  Module::mapInstruction(&this->module,local_38);
  IVar1 = Instruction::getResultId(local_38);
  return IVar1;
}

Assistant:

Id Builder::makeIntConstant(Id typeId, unsigned value, bool specConstant)
{
    Op opcode = specConstant ? OpSpecConstant : OpConstant;

    // See if we already made it. Applies only to regular constants, because specialization constants
    // must remain distinct for the purpose of applying a SpecId decoration.
    if (! specConstant) {
        Id existing = findScalarConstant(OpTypeInt, opcode, typeId, value);
        if (existing)
            return existing;
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    c->addImmediateOperand(value);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    groupedConstants[OpTypeInt].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}